

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaVector.cpp
# Opt level: O0

void __thiscall NaVector::read_file(NaVector *this,NaDataFile *pDF,int iVar)

{
  undefined4 uVar1;
  undefined4 *puVar2;
  ulong uVar3;
  undefined8 *puVar4;
  undefined4 in_EDX;
  long *in_RSI;
  long *in_RDI;
  undefined8 uVar5;
  uint i;
  int local_18;
  
  if (in_RSI == (long *)0x0) {
    puVar2 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar2 = 0;
    __cxa_throw(puVar2,&NaException::typeinfo,0);
  }
  uVar1 = (**(code **)(*in_RSI + 0x38))();
  (**(code **)(*in_RDI + 0x20))(in_RDI,uVar1);
  local_18 = 0;
  (**(code **)(*in_RSI + 0x28))();
  while( true ) {
    uVar3 = (**(code **)(*in_RSI + 0x20))();
    if ((uVar3 & 1) == 0) break;
    uVar5 = (**(code **)(*in_RSI + 0x18))(in_RSI,in_EDX);
    puVar4 = (undefined8 *)(**(code **)(*in_RDI + 0x38))(in_RDI,local_18);
    *puVar4 = uVar5;
    local_18 = local_18 + 1;
  }
  return;
}

Assistant:

void
NaVector::read_file (NaDataFile* pDF, int iVar)
{
    if(NULL == pDF)
        throw(na_null_pointer);

    new_dim(pDF->CountOfRecord());

    unsigned    i;
    for(i = 0, pDF->GoStartRecord(); pDF->GoNextRecord(); ++i){
        fetch(i) = pDF->GetValue(iVar);
    }   // Cycle for all data in file
}